

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O0

void __thiscall TCLAP::StdOutput::failure(StdOutput *this,CmdLineInterface *_cmd,ArgException *e)

{
  byte bVar1;
  string *psVar2;
  ostream *poVar3;
  void *pvVar4;
  ExitException *this_00;
  long *in_RSI;
  long *in_RDI;
  string progName;
  ArgException *in_stack_fffffffffffffee8;
  ArgException *in_stack_ffffffffffffff18;
  string local_88 [32];
  string local_68 [48];
  string local_38 [40];
  long *local_10;
  
  local_10 = in_RSI;
  psVar2 = (string *)(**(code **)(*in_RSI + 0x50))();
  std::__cxx11::string::string(local_38,psVar2);
  poVar3 = std::operator<<((ostream *)&std::cerr,"PARSE ERROR: ");
  ArgException::argId_abi_cxx11_(in_stack_ffffffffffffff18);
  poVar3 = std::operator<<(poVar3,local_68);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"             ");
  ArgException::error_abi_cxx11_(in_stack_fffffffffffffee8);
  poVar3 = std::operator<<(poVar3,local_88);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  bVar1 = (**(code **)(*local_10 + 0x78))();
  if ((bVar1 & 1) == 0) {
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_10);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Brief USAGE: ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    _shortUsage((StdOutput *)e,(CmdLineInterface *)progName.field_2._8_8_,
                (ostream *)progName.field_2._M_allocated_capacity);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"For complete USAGE and HELP type: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"   ");
    poVar3 = std::operator<<(poVar3,local_38);
    poVar3 = std::operator<<(poVar3," --help");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  this_00 = (ExitException *)__cxa_allocate_exception(4);
  ExitException::ExitException(this_00,1);
  __cxa_throw(this_00,&ExitException::typeinfo,0);
}

Assistant:

inline void StdOutput::failure( CmdLineInterface& _cmd,
								ArgException& e ) 
{
	std::string progName = _cmd.getProgramName();

	std::cerr << "PARSE ERROR: " << e.argId() << std::endl
		      << "             " << e.error() << std::endl << std::endl;

	if ( _cmd.hasHelpAndVersion() )
		{
			std::cerr << "Brief USAGE: " << std::endl;

			_shortUsage( _cmd, std::cerr );	

			std::cerr << std::endl << "For complete USAGE and HELP type: " 
					  << std::endl << "   " << progName << " --help" 
					  << std::endl << std::endl;
		}
	else
		usage(_cmd);

	throw ExitException(1);
}